

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_tests.cpp
# Opt level: O0

void __thiscall pool_tests::random_allocations::test_method(random_allocations *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  long in_FS_OFFSET;
  PtrSizeAlignment *x_1;
  vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *__range1;
  value_type *x;
  size_t size;
  size_t alignment;
  size_t i;
  iterator __end1;
  iterator __begin1;
  void *ptr;
  vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> ptr_size_alignment;
  PoolResource<128UL,_8UL> resource;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffd08;
  lazy_ostream *in_stack_fffffffffffffd10;
  PoolResource<128UL,_8UL> *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  lazy_ostream *in_stack_fffffffffffffd28;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  lazy_ostream *in_stack_fffffffffffffd40;
  RandomMixin<FastRandomContext> *this_00;
  PoolResource<128UL,_8UL> *resource_00;
  const_string local_228 [2];
  lazy_ostream local_208 [2];
  const_string local_190 [2];
  lazy_ostream local_170;
  assertion_result local_128 [2];
  void *local_f0;
  undefined1 local_e8 [224];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  PoolResource<128UL,_8UL>::PoolResource
            ((PoolResource<128UL,_8UL> *)
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
             (size_t)in_stack_fffffffffffffd30);
  memset(local_e8,0,0x18);
  std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::vector
            ((vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *)
             in_stack_fffffffffffffd08);
  for (resource_00 = (PoolResource<128UL,_8UL> *)0x0;
      resource_00 < (PoolResource<128UL,_8UL> *)0x3e8;
      resource_00 = (PoolResource<128UL,_8UL> *)((long)&resource_00->m_chunk_size_bytes + 1)) {
    bVar1 = std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::empty
                      ((vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *)
                       in_stack_fffffffffffffd18);
    if ((bVar1) ||
       (iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                          (in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20)
                          ), iVar2 != 0)) {
      RandomMixin<FastRandomContext>::randrange<int>
                (in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
      RandomMixin<FastRandomContext>::randrange<int>
                (in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
      local_f0 = PoolResource<128UL,_8UL>::Allocate
                           ((PoolResource<128UL,_8UL> *)
                            CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                            (size_t)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
      do {
        this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)in_stack_fffffffffffffd10,(unsigned_long)in_stack_fffffffffffffd08);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)this_00,(const_string *)in_stack_fffffffffffffd40,
                   CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                   (const_string *)in_stack_fffffffffffffd30);
        boost::test_tools::assertion::seed::operator->*
                  ((seed *)in_stack_fffffffffffffd10,(void **)in_stack_fffffffffffffd08);
        boost::test_tools::assertion::
        expression_base<boost::test_tools::assertion::value_expr<void*&>,void*>::operator!=
                  ((expression_base<boost::test_tools::assertion::value_expr<void_*&>,_void_*> *)
                   in_stack_fffffffffffffd10,(void **)in_stack_fffffffffffffd08);
        boost::test_tools::assertion::
        binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_std::nullptr_t,_boost::test_tools::assertion::op::NE<void_*,_std::nullptr_t,_void>_>
        ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_std::nullptr_t,_boost::test_tools::assertion::op::NE<void_*,_std::nullptr_t,_void>_>
                    *)in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f);
        in_stack_fffffffffffffd40 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)in_stack_fffffffffffffd10,(unsigned_long)in_stack_fffffffffffffd08);
        boost::unit_test::operator<<
                  (in_stack_fffffffffffffd10,(basic_cstring<const_char> *)in_stack_fffffffffffffd08)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)in_stack_fffffffffffffd10,(unsigned_long)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd08 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_128,&local_170,local_190,0x89,CHECK,CHECK_BUILT_ASSERTION);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(in_stack_fffffffffffffd08);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd3f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffd3f);
      do {
        in_stack_fffffffffffffd30 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)in_stack_fffffffffffffd10,(unsigned_long)in_stack_fffffffffffffd08);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)this_00,(const_string *)in_stack_fffffffffffffd40,
                   CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                   (const_string *)in_stack_fffffffffffffd30);
        boost::test_tools::assertion::seed::operator->*
                  ((seed *)in_stack_fffffffffffffd10,(unsigned_long *)in_stack_fffffffffffffd08);
        boost::test_tools::assertion::
        expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,unsigned_long>::
        operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long>
                    *)in_stack_fffffffffffffd10,(int *)in_stack_fffffffffffffd08);
        boost::test_tools::assertion::
        binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
        ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
                    *)in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f);
        in_stack_fffffffffffffd28 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)in_stack_fffffffffffffd10,(unsigned_long)in_stack_fffffffffffffd08);
        boost::unit_test::operator<<
                  (in_stack_fffffffffffffd10,(basic_cstring<const_char> *)in_stack_fffffffffffffd08)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                   (pointer)in_stack_fffffffffffffd10,(unsigned_long)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd08 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&stack0xfffffffffffffe38,local_208,local_228,0x8a,CHECK,
                   CHECK_BUILT_ASSERTION);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(in_stack_fffffffffffffd08);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd27 = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffd27);
      std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::push_back
                ((vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *)
                 in_stack_fffffffffffffd08,(value_type *)0x902cc2);
    }
    else {
      in_stack_fffffffffffffd18 = (PoolResource<128UL,_8UL> *)(in_RDI + 0x110);
      std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::size
                ((vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *)
                 in_stack_fffffffffffffd08);
      RandomMixin<FastRandomContext>::randrange<unsigned_long>
                (in_stack_fffffffffffffd30,(unsigned_long)in_stack_fffffffffffffd28);
      pvVar3 = std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::operator[]
                         ((vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *)
                          in_stack_fffffffffffffd18,(size_type)in_stack_fffffffffffffd10);
      PoolResource<128UL,_8UL>::Deallocate
                ((PoolResource<128UL,_8UL> *)
                 CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
      pvVar4 = std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::back
                         ((vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *)
                          in_stack_fffffffffffffd08);
      pvVar3->ptr = pvVar4->ptr;
      pvVar3->bytes = pvVar4->bytes;
      pvVar3->alignment = pvVar4->alignment;
      std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::pop_back
                ((vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *)
                 in_stack_fffffffffffffd08);
    }
  }
  std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::begin
            ((vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *)
             in_stack_fffffffffffffd10);
  std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::end
            ((vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *)
             in_stack_fffffffffffffd10);
  while (bVar1 = __gnu_cxx::
                 operator==<PtrSizeAlignment_*,_std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>_>
                           ((__normal_iterator<PtrSizeAlignment_*,_std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>_>
                             *)in_stack_fffffffffffffd18,
                            (__normal_iterator<PtrSizeAlignment_*,_std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>_>
                             *)in_stack_fffffffffffffd10), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<PtrSizeAlignment_*,_std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>_>
    ::operator*((__normal_iterator<PtrSizeAlignment_*,_std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>_>
                 *)in_stack_fffffffffffffd08);
    PoolResource<128UL,_8UL>::Deallocate
              ((PoolResource<128UL,_8UL> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
               CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    __gnu_cxx::
    __normal_iterator<PtrSizeAlignment_*,_std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>_>
    ::operator++((__normal_iterator<PtrSizeAlignment_*,_std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>_>
                  *)in_stack_fffffffffffffd08);
  }
  PoolResourceTester::CheckAllDataAccountedFor<128ul,8ul>(resource_00);
  std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::~vector
            ((vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *)
             in_stack_fffffffffffffd18);
  PoolResource<128UL,_8UL>::~PoolResource(in_stack_fffffffffffffd18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(random_allocations)
{
    struct PtrSizeAlignment {
        void* ptr;
        size_t bytes;
        size_t alignment;
    };

    // makes a bunch of random allocations and gives all of them back in random order.
    auto resource = PoolResource<128, 8>(65536);
    std::vector<PtrSizeAlignment> ptr_size_alignment{};
    for (size_t i = 0; i < 1000; ++i) {
        // make it a bit more likely to allocate than deallocate
        if (ptr_size_alignment.empty() || 0 != m_rng.randrange(4)) {
            // allocate a random item
            std::size_t alignment = std::size_t{1} << m_rng.randrange(8);          // 1, 2, ..., 128
            std::size_t size = (m_rng.randrange(200) / alignment + 1) * alignment; // multiple of alignment
            void* ptr = resource.Allocate(size, alignment);
            BOOST_TEST(ptr != nullptr);
            BOOST_TEST((reinterpret_cast<uintptr_t>(ptr) & (alignment - 1)) == 0);
            ptr_size_alignment.push_back({ptr, size, alignment});
        } else {
            // deallocate a random item
            auto& x = ptr_size_alignment[m_rng.randrange(ptr_size_alignment.size())];
            resource.Deallocate(x.ptr, x.bytes, x.alignment);
            x = ptr_size_alignment.back();
            ptr_size_alignment.pop_back();
        }
    }

    // deallocate all the rest
    for (auto const& x : ptr_size_alignment) {
        resource.Deallocate(x.ptr, x.bytes, x.alignment);
    }

    PoolResourceTester::CheckAllDataAccountedFor(resource);
}